

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O0

void write_constraints<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,problem *pb)

{
  size_type sVar1;
  const_reference pvVar2;
  size_t e_2;
  size_t i_2;
  size_t e_1;
  size_t i_1;
  size_t e;
  size_t i;
  problem *pb_local;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx_local;
  
  e = 0;
  sVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&pb->equal_constraints);
  for (; e != sVar1; e = e + 1) {
    pvVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                       (&pb->equal_constraints,e);
    write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,baryonyx::constraint>
              (ctx,pb,pvVar2," = ");
  }
  e_1 = 0;
  sVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&pb->greater_constraints);
  for (; e_1 != sVar1; e_1 = e_1 + 1) {
    pvVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                       (&pb->greater_constraints,e_1);
    write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,baryonyx::constraint>
              (ctx,pb,pvVar2," >= ");
  }
  e_2 = 0;
  sVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&pb->less_constraints);
  for (; e_2 != sVar1; e_2 = e_2 + 1) {
    pvVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                       (&pb->less_constraints,e_2);
    write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,baryonyx::constraint>
              (ctx,pb,pvVar2," <= ");
  }
  return;
}

Assistant:

void
write_constraints(FormatContext& ctx, const Problem& pb)
{
    for (std::size_t i = 0, e = pb.equal_constraints.size(); i != e; ++i)
        write_constraint(ctx, pb, pb.equal_constraints[i], " = ");

    for (std::size_t i = 0, e = pb.greater_constraints.size(); i != e; ++i)
        write_constraint(ctx, pb, pb.greater_constraints[i], " >= ");

    for (std::size_t i = 0, e = pb.less_constraints.size(); i != e; ++i)
        write_constraint(ctx, pb, pb.less_constraints[i], " <= ");
}